

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O2

void duckdb::MaxOperation::Combine<duckdb::MinMaxState<duckdb::interval_t>,duckdb::MaxOperation>
               (MinMaxState<duckdb::interval_t> *source,MinMaxState<duckdb::interval_t> *target,
               AggregateInputData *param_3)

{
  int64_t iVar1;
  undefined7 uVar2;
  int32_t iVar3;
  bool bVar4;
  
  if (source->isset == true) {
    if (target->isset == false) {
      uVar2 = *(undefined7 *)&source->field_0x11;
      target->isset = source->isset;
      *(undefined7 *)&target->field_0x11 = uVar2;
    }
    else {
      bVar4 = interval_t::operator>(&source->value,&target->value);
      if (!bVar4) {
        return;
      }
    }
    iVar3 = (source->value).days;
    iVar1 = (source->value).micros;
    (target->value).months = (source->value).months;
    (target->value).days = iVar3;
    (target->value).micros = iVar1;
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.isset) {
			// source is NULL, nothing to do
			return;
		}
		if (!target.isset) {
			// target is NULL, use source value directly
			target = source;
		} else if (LessThan::Operation(target.value, source.value)) {
			target.value = source.value;
		}
	}